

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,StringRef message)

{
  pointer pIVar1;
  TestCaseStats *this_00;
  AssertionResultData *this_01;
  TestRunStats *this_02;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  Totals deltaTotals;
  TestCaseInfo *testInfo;
  SectionStats testCaseSectionStats;
  Counts assertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  AssertionResult result;
  AssertionResultData tempResult;
  undefined1 in_stack_fffffffffffffb0f;
  TestCaseStats *in_stack_fffffffffffffb10;
  AssertionInfo *in_stack_fffffffffffffb18;
  string *this_03;
  RunContext *in_stack_fffffffffffffb20;
  SectionInfo *in_stack_fffffffffffffb28;
  SectionStats *in_stack_fffffffffffffb30;
  TestCaseStats *_stdErr;
  undefined8 in_stack_fffffffffffffb38;
  OfType _resultType;
  string *_stdOut;
  AssertionResultData *in_stack_fffffffffffffb40;
  Totals *_totals;
  StringRef *in_stack_fffffffffffffb48;
  TestCaseInfo *_testInfo;
  undefined1 local_478 [72];
  size_t in_stack_fffffffffffffbd0;
  size_t in_stack_fffffffffffffbd8;
  Totals *in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbe8;
  RunContext *in_stack_fffffffffffffbf0;
  string local_3f0 [8];
  AssertionResult *in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  Totals local_3d0 [6];
  string local_280;
  undefined8 local_258;
  TestCaseStats *local_248;
  undefined1 local_240 [128];
  Counts local_1c0 [4];
  TestCaseInfo *local_158;
  string local_b0 [32];
  LazyExpression local_90;
  string local_80 [88];
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined8 local_10;
  undefined8 uStack_8;
  
  _resultType = (OfType)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x23b198);
  local_28 = (undefined4)local_10;
  uStack_24 = local_10._4_4_;
  uStack_20 = (undefined4)uStack_8;
  uStack_1c = uStack_8._4_4_;
  (*pIVar1->_vptr_IStreamingReporter[0x10])(pIVar1,local_10,uStack_8);
  LazyExpression::LazyExpression(&local_90,false);
  AssertionResultData::AssertionResultData
            (in_stack_fffffffffffffb40,_resultType,(LazyExpression *)in_stack_fffffffffffffb30);
  StringRef::operator_cast_to_string(in_stack_fffffffffffffb48);
  std::__cxx11::string::operator=(local_80,local_b0);
  std::__cxx11::string::~string(local_b0);
  AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
             (AssertionResultData *)in_stack_fffffffffffffb10);
  assertionEnded((RunContext *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  handleUnfinishedSections(in_stack_fffffffffffffb20);
  local_158 = TestCase::getTestCaseInfo(*(TestCase **)(in_RDI + 0x38));
  SectionInfo::SectionInfo
            ((SectionInfo *)in_stack_fffffffffffffb20,(SourceLineInfo *)in_stack_fffffffffffffb18,
             (string *)in_stack_fffffffffffffb10);
  Counts::Counts(local_1c0);
  local_1c0[0].failed = 1;
  SectionStats::SectionStats
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(Counts *)in_stack_fffffffffffffb20
             ,(double)in_stack_fffffffffffffb18,SUB81((ulong)in_stack_fffffffffffffb10 >> 0x38,0));
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x23b305);
  (*pIVar1->_vptr_IStreamingReporter[0xb])(pIVar1,local_240);
  this_00 = (TestCaseStats *)TestCase::getTestCaseInfo(*(TestCase **)(in_RDI + 0x38));
  _stdOut = &local_280;
  local_248 = this_00;
  Totals::Totals((Totals *)in_stack_fffffffffffffb10);
  local_258 = 1;
  local_280.field_2._M_allocated_capacity = 1;
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x23b378);
  _totals = local_3d0;
  _stdErr = local_248;
  std::__cxx11::string::string((string *)_totals);
  _testInfo = (TestCaseInfo *)local_3f0;
  std::__cxx11::string::string((string *)_testInfo);
  TestCaseStats::TestCaseStats
            (this_00,_testInfo,_totals,_stdOut,(string *)_stdErr,SUB81((ulong)pIVar1 >> 0x38,0));
  (*pIVar1->_vptr_IStreamingReporter[0xc])(pIVar1,&local_3d0[0].testCases);
  TestCaseStats::~TestCaseStats(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(local_3f0);
  std::__cxx11::string::~string((string *)local_3d0);
  this_02 = (TestRunStats *)(in_RDI + 0xf0);
  *(long *)(in_RDI + 0x118) = *(long *)(in_RDI + 0x118) + 1;
  this_03 = (string *)&stack0xfffffffffffffbf0;
  std::__cxx11::string::string(this_03);
  testGroupEnded(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                 in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbf0);
  this_01 = (AssertionResultData *)
            clara::std::
            unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
            operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)0x23b487);
  TestRunStats::TestRunStats
            (this_02,(TestRunInfo *)this_03,(Totals *)this_01,(bool)in_stack_fffffffffffffb0f);
  (**(code **)(*(long *)&this_01->message + 0x70))(this_01,local_478);
  TestRunStats::~TestRunStats((TestRunStats *)0x23b4d5);
  SectionStats::~SectionStats((SectionStats *)0x23b4e2);
  SectionInfo::~SectionInfo((SectionInfo *)this_01);
  AssertionResult::~AssertionResult((AssertionResult *)0x23b4fc);
  AssertionResultData::~AssertionResultData(this_01);
  return;
}

Assistant:

void RunContext::handleFatalErrorCondition( StringRef message ) {
        // First notify reporter that bad things happened
        m_reporter->fatalErrorEncountered(message);

        // Don't rebuild the result -- the stringification itself can cause more fatal errors
        // Instead, fake a result data.
        AssertionResultData tempResult( ResultWas::FatalErrorCondition, { false } );
        tempResult.message = static_cast<std::string>(message);
        AssertionResult result(m_lastAssertionInfo, tempResult);

        assertionEnded(result);

        handleUnfinishedSections();

        // Recreate section for test case (as we will lose the one that was in scope)
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);

        Counts assertions;
        assertions.failed = 1;
        SectionStats testCaseSectionStats(testCaseSection, assertions, 0, false);
        m_reporter->sectionEnded(testCaseSectionStats);

        auto const& testInfo = m_activeTestCase->getTestCaseInfo();

        Totals deltaTotals;
        deltaTotals.testCases.failed = 1;
        deltaTotals.assertions.failed = 1;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  std::string(),
                                  std::string(),
                                  false));
        m_totals.testCases.failed++;
        testGroupEnded(std::string(), m_totals, 1, 1);
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, false));
    }